

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  uint uVar6;
  WeightParamType WVar7;
  WeightParams *pWVar8;
  ActivationParametricSoftplus *pAVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  char cVar13;
  char cVar14;
  uint uVar15;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  uVar15 = params->_oneof_case_[0] - 10;
  uVar12 = (ulong)uVar15;
  if (uVar15 < 0x3e) {
    if ((0x10040100c0300421U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_005621f9;
    if (uVar12 == 0xf) {
      pWVar8 = ((params->NonlinearityType_).prelu_)->alpha_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      uVar15 = (uint)(0 < (pWVar8->floatvalue_).current_size_);
      uVar6 = uVar15 + 1;
      if (((pWVar8->float16value_).ptr_)->_M_string_length == 0) {
        uVar6 = uVar15;
      }
      if (1 < ((uVar6 - (((pWVar8->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
              (uint)(((pWVar8->int8rawvalue_).ptr_)->_M_string_length == 0)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
        pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198," has inconsistent weight parameter types.",0x29);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
        goto LAB_00562610;
      }
      goto LAB_005621f9;
    }
    if (uVar12 == 0x3d) {
      pWVar8 = ((params->NonlinearityType_).prelu_)->alpha_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar8->floatvalue_).current_size_;
      sVar2 = ((pWVar8->float16value_).ptr_)->_M_string_length;
      uVar15 = (0 < iVar1) + 1;
      if (sVar2 == 0) {
        uVar15 = (uint)(0 < iVar1);
      }
      sVar3 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
      sVar4 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
      uVar6 = (uint)(sVar4 == 0);
      uVar15 = (uVar15 - (sVar3 == 0)) + 2;
      cVar13 = '\x04';
      if (uVar15 - uVar6 < 2) {
        cVar13 = '\x05';
        if (uVar15 != uVar6) {
          cVar13 = iVar1 < 1;
        }
        if ((((sVar2 == 0) && (iVar1 < 1)) && (uVar15 != uVar6)) &&
           ((((sVar3 == 0 ||
              (pWVar8 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar13 = '\x02', pWVar8->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar4 == 0 ||
              (pWVar8 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar13 = '\x03', pWVar8->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar13 = '\x05';
        }
      }
      if (params->_oneof_case_[0] == 0x47) {
        pAVar9 = (params->NonlinearityType_).parametricsoftplus_;
      }
      else {
        pAVar9 = Specification::ActivationParametricSoftplus::default_instance();
      }
      pWVar8 = pAVar9->beta_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar8->floatvalue_).current_size_;
      sVar2 = ((pWVar8->float16value_).ptr_)->_M_string_length;
      uVar15 = (0 < iVar1) + 1;
      if (sVar2 == 0) {
        uVar15 = (uint)(0 < iVar1);
      }
      sVar3 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
      sVar4 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
      uVar6 = (uint)(sVar4 == 0);
      uVar15 = (uVar15 - (sVar3 == 0)) + 2;
      cVar14 = '\x04';
      if (uVar15 - uVar6 < 2) {
        cVar14 = '\x05';
        if (uVar15 != uVar6) {
          cVar14 = iVar1 < 1;
        }
        if ((((sVar2 == 0) && (iVar1 < 1)) && (uVar15 != uVar6)) &&
           ((((sVar3 == 0 ||
              (pWVar8 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar14 = '\x02', pWVar8->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar4 == 0 ||
              (pWVar8 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar14 = '\x03', pWVar8->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar14 = '\x05';
        }
      }
      if (cVar13 == cVar14) {
        if (params->_oneof_case_[0] == 0x47) {
          pAVar9 = (ActivationParametricSoftplus *)(params->NonlinearityType_).prelu_;
        }
        else {
          pAVar9 = Specification::ActivationParametricSoftplus::default_instance();
        }
        pWVar8 = pAVar9->alpha_;
        if (pWVar8 == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        bVar5 = 0 < (pWVar8->floatvalue_).current_size_;
        uVar15 = bVar5 + 1;
        if (((pWVar8->float16value_).ptr_)->_M_string_length == 0) {
          uVar15 = (uint)bVar5;
        }
        if (((uVar15 - (((pWVar8->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
            (uint)(((pWVar8->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
          if (params->_oneof_case_[0] == 0x47) {
            pAVar9 = (params->NonlinearityType_).parametricsoftplus_;
          }
          else {
            pAVar9 = Specification::ActivationParametricSoftplus::default_instance();
          }
          pWVar8 = pAVar9->beta_;
          if (pWVar8 == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar7 = valueType(pWVar8);
          if (WVar7 != UNSPECIFIED) goto LAB_005621f9;
        }
      }
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
      pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198," has inconsistent weight parameter types.",0x29);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
      goto LAB_00562610;
    }
  }
  if (params->_oneof_case_[0] != 5) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
    pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198," is not supported in this version of CoreML.",0x2c);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
LAB_00562610:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
LAB_005621f9:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}